

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O2

void __thiscall
axl::sl::StringRefBase<short,_axl::sl::StringDetailsBase<short>_>::attachBufHdr
          (StringRefBase<short,_axl::sl::StringDetailsBase<short>_> *this,BufHdr *hdr)

{
  int32_t *piVar1;
  BufHdr *this_00;
  
  this_00 = this->m_hdr;
  if (this_00 != hdr) {
    if (hdr != (BufHdr *)0x0) {
      LOCK();
      piVar1 = &(hdr->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      this_00 = this->m_hdr;
    }
    if (this_00 != (BufHdr *)0x0) {
      rc::RefCount::release(&this_00->super_RefCount);
    }
    this->m_hdr = hdr;
  }
  return;
}

Assistant:

void
	attachBufHdr(rc::BufHdr* hdr) const {
		if (hdr == m_hdr)
			return; // try to avoid unnecessary interlocked ops

		if (hdr)
			hdr->addRef();

		if (m_hdr)
			m_hdr->release();

		m_hdr = hdr;
	}